

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomCommandCommand.cxx
# Opt level: O2

bool __thiscall
cmAddCustomCommandCommand::CheckOutputs
          (cmAddCustomCommandCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [11];
  
  __rhs = (outputs->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  do {
    pbVar1 = (outputs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (__rhs == pbVar1) {
LAB_0032d439:
      return __rhs == pbVar1;
    }
    bVar2 = cmMakefile::CanIWriteThisFile
                      ((this->super_cmCommand).Makefile,(__rhs->_M_dataplus)._M_p);
    if (!bVar2) {
      std::operator+(&bStack_1c8,"attempted to have a file \"",__rhs);
      std::operator+(local_1a8,&bStack_1c8,
                     "\" in a source directory as an output of custom command.");
      std::__cxx11::string::~string((string *)&bStack_1c8);
      cmCommand::SetError(&this->super_cmCommand,local_1a8);
      cmSystemTools::s_FatalErrorOccured = true;
      std::__cxx11::string::~string((string *)local_1a8);
      goto LAB_0032d439;
    }
    lVar3 = std::__cxx11::string::find_first_of((char *)__rhs,0x504abd);
    if (lVar3 != -1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar4 = std::operator<<((ostream *)local_1a8,"called with OUTPUT containing a \"");
      poVar4 = std::operator<<(poVar4,(__rhs->_M_dataplus)._M_p[lVar3]);
      std::operator<<(poVar4,"\".  This character is not allowed.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&bStack_1c8);
      std::__cxx11::string::~string((string *)&bStack_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      goto LAB_0032d439;
    }
    __rhs = __rhs + 1;
  } while( true );
}

Assistant:

bool cmAddCustomCommandCommand::CheckOutputs(
  const std::vector<std::string>& outputs)
{
  for (std::vector<std::string>::const_iterator o = outputs.begin();
       o != outputs.end(); ++o) {
    // Make sure the file will not be generated into the source
    // directory during an out of source build.
    if (!this->Makefile->CanIWriteThisFile(o->c_str())) {
      std::string e = "attempted to have a file \"" + *o +
        "\" in a source directory as an output of custom command.";
      this->SetError(e);
      cmSystemTools::SetFatalErrorOccured();
      return false;
    }

    // Make sure the output file name has no invalid characters.
    std::string::size_type pos = o->find_first_of("#<>");
    if (pos != std::string::npos) {
      std::ostringstream msg;
      msg << "called with OUTPUT containing a \"" << (*o)[pos]
          << "\".  This character is not allowed.";
      this->SetError(msg.str());
      return false;
    }
  }
  return true;
}